

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_strtrimr(mpc_val_t *x)

{
  ushort **ppuVar1;
  bool bVar2;
  size_t local_20;
  size_t l;
  char *s;
  mpc_val_t *x_local;
  
  local_20 = strlen((char *)x);
  while( true ) {
    bVar2 = false;
    if (local_20 != 0) {
      ppuVar1 = __ctype_b_loc();
      bVar2 = ((*ppuVar1)[(int)(uint)*(byte *)((long)x + (local_20 - 1))] & 0x2000) != 0;
    }
    if (!bVar2) break;
    *(undefined1 *)((long)x + (local_20 - 1)) = 0;
    local_20 = local_20 - 1;
  }
  return x;
}

Assistant:

mpc_val_t *mpcf_strtrimr(mpc_val_t *x) {
  char *s = x;
  size_t l = strlen(s);
  while (l > 0 && isspace((unsigned char)s[l-1])) {
    s[l-1] = '\0'; l--;
  }
  return s;
}